

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O1

void google::glog_internal_namespace_::AlsoErrorWrite(LogSeverity severity,char *tag,char *message)

{
  return;
}

Assistant:

void AlsoErrorWrite(LogSeverity severity, const char* tag,
                    const char* message) noexcept {
#if defined(GLOG_OS_WINDOWS)
  (void)severity;
  (void)tag;
  // On Windows, also output to the debugger
  ::OutputDebugStringA(message);
#elif defined(__ANDROID__)
  constexpr int android_log_levels[] = {
      ANDROID_LOG_INFO,
      ANDROID_LOG_WARN,
      ANDROID_LOG_ERROR,
      ANDROID_LOG_FATAL,
  };

  __android_log_write(android_log_levels[severity], tag, message);
#else
  (void)severity;
  (void)tag;
  (void)message;
#endif
}